

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_IsGlyphEmpty(stbtt_fontinfo *info,int glyph_index)

{
  stbtt_int16 sVar1;
  int iVar2;
  long in_RDI;
  int g;
  stbtt_int16 numberOfContours;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int *in_stack_00000040;
  int in_stack_0000004c;
  stbtt_fontinfo *in_stack_00000050;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  if (*(int *)(in_RDI + 0x4c) == 0) {
    iVar2 = stbtt__GetGlyfOffset
                      ((stbtt_fontinfo *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 < 0) {
      uVar3 = 1;
    }
    else {
      sVar1 = ttSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)iVar2));
      uVar3 = (uint)(sVar1 == 0);
    }
  }
  else {
    iVar2 = stbtt__GetGlyphInfoT2
                      (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_00000038,
                       in_stack_00000030,in_stack_00000028);
    uVar3 = (uint)(iVar2 == 0);
  }
  return uVar3;
}

Assistant:

STBTT_DEF int stbtt_IsGlyphEmpty(const stbtt_fontinfo *info, int glyph_index)
{
stbtt_int16 numberOfContours;
int g;
if (info->cff.size)
return stbtt__GetGlyphInfoT2(info, glyph_index, NULL, NULL, NULL, NULL) == 0;
g = stbtt__GetGlyfOffset(info, glyph_index);
if (g < 0) return 1;
numberOfContours = ttSHORT(info->data + g);
return numberOfContours == 0;
}